

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.upb.h
# Opt level: O2

int32_t google_protobuf_FileDescriptorProto_edition(google_protobuf_FileDescriptorProto *msg)

{
  _Bool _Var1;
  uint in_EAX;
  int32_t ret;
  int32_t default_val;
  undefined8 local_18;
  
  local_18 = (ulong)in_EAX;
  _Var1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only
                    ((upb_MiniTableField *)&DAT_001344ec,(void *)((long)&local_18 + 4));
  if ((!_Var1) &&
     (_Var1 = upb_Message_HasBaseField
                        (&msg->base_dont_copy_me__upb_internal_use_only,
                         (upb_MiniTableField *)&DAT_001344ec), !_Var1)) {
    return 0;
  }
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
            ((upb_MiniTableField *)&DAT_001344ec,&local_18,
             (void *)((long)&msg[1].base_dont_copy_me__upb_internal_use_only.field_0 + 4));
  return (int32_t)local_18;
}

Assistant:

UPB_INLINE int32_t google_protobuf_FileDescriptorProto_edition(const google_protobuf_FileDescriptorProto* msg) {
  int32_t default_val = 0;
  int32_t ret;
  const upb_MiniTableField field = {14, UPB_SIZE(48, 12), 69, 6, 14, (int)kUpb_FieldMode_Scalar | ((int)kUpb_FieldRep_4Byte << kUpb_FieldRep_Shift)};
  _upb_Message_GetNonExtensionField(UPB_UPCAST(msg), &field,
                                    &default_val, &ret);
  return ret;
}